

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::getFormattedString(XMLAbstractDoubleFloat *this)

{
  XMLAbstractDoubleFloat *temp;
  XMLAbstractDoubleFloat *this_local;
  
  if ((this->fDataConverted & 1U) == 0) {
    this_local = (XMLAbstractDoubleFloat *)this->fRawData;
  }
  else {
    if (this->fFormattedString == (XMLCh *)0x0) {
      formatString(this);
    }
    this_local = (XMLAbstractDoubleFloat *)this->fFormattedString;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh*  XMLAbstractDoubleFloat::getFormattedString() const
{
    if (!fDataConverted)
    {
        return fRawData;
    }
    else 
    {
        if (!fFormattedString)    	
        {
            XMLAbstractDoubleFloat *temp = (XMLAbstractDoubleFloat *) this;
            temp->formatString();
        }

        return fFormattedString;           
    }

}